

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O3

bool __thiscall ROM::Request::Node::subtract(Node *this,Map *map)

{
  Name NVar1;
  _Base_ptr p_Var2;
  iterator __position;
  Type TVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  byte bVar6;
  _Base_ptr p_Var7;
  byte bVar8;
  bool bVar9;
  
  TVar3 = this->type;
  if (TVar3 == One) {
    p_Var2 = (map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &(map->_M_t)._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var5->_M_header;
    if (p_Var2 != (_Base_ptr)0x0) {
      NVar1 = this->name;
      p_Var4 = &p_Var5->_M_header;
      do {
        if ((int)NVar1 <= (int)p_Var2[1]._M_color) {
          p_Var4 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < (int)NVar1];
      } while (p_Var2 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var4 != p_Var5) &&
         (p_Var7 = p_Var4, (int)NVar1 < (int)p_Var4[1]._M_color)) {
        p_Var7 = &p_Var5->_M_header;
      }
    }
    bVar9 = (_Rb_tree_header *)p_Var7 != p_Var5;
  }
  else {
    __position._M_current =
         (this->children).
         super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (__position._M_current ==
        (this->children).super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar6 = 0;
      bVar8 = 1;
    }
    else {
      bVar8 = 1;
      bVar6 = 0;
      do {
        bVar9 = subtract(__position._M_current,map);
        if (bVar9) {
          __position = std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::
                       _M_erase(&this->children,__position);
        }
        else {
          __position._M_current = __position._M_current + 1;
        }
        bVar8 = bVar8 & bVar9;
        bVar6 = bVar6 | bVar9;
      } while (__position._M_current !=
               (this->children).
               super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
               super__Vector_impl_data._M_finish);
      TVar3 = this->type;
    }
    bVar9 = true;
    if ((TVar3 != All) || (bVar8 == 0)) {
      bVar9 = (bool)(TVar3 == Any & bVar6);
    }
  }
  return bVar9;
}

Assistant:

bool Request::Node::subtract(const ROM::Map &map) {
	switch(type) {
		case Type::One:
		return map.find(name) != map.end();

		default: {
			bool has_all = true;
			bool has_any = false;

			auto iterator = children.begin();
			while(iterator != children.end()) {
				const bool did_subtract = iterator->subtract(map);
				has_all &= did_subtract;
				has_any |= did_subtract;
				if(did_subtract) {
					iterator = children.erase(iterator);
				} else {
					++iterator;
				}
			}

			return (type == Type::All && has_all) || (type == Type::Any && has_any);
		}
	}
}